

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

void __thiscall SFFile::SetAllOrders(SFFile *this,int order)

{
  SFPerc *pSVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  if (0 < this->NumPresets) {
    lVar2 = 0x15;
    lVar4 = 0;
    do {
      this->Presets->Name[lVar2] = this->Presets->Name[lVar2] & 0x80U | (byte)order & 0x7f;
      lVar4 = lVar4 + 1;
      lVar2 = lVar2 + 0x1c;
    } while (lVar4 < this->NumPresets);
  }
  uVar3 = (ulong)(this->Percussion).Count;
  if (uVar3 != 0) {
    pSVar1 = (this->Percussion).Array;
    lVar2 = 0;
    do {
      (&pSVar1->LoadOrder)[lVar2] = (byte)order;
      lVar2 = lVar2 + 0x70;
    } while (uVar3 * 0x70 - lVar2 != 0);
  }
  return;
}

Assistant:

void SFFile::SetAllOrders(int order)
{
	for (int i = 0; i < NumPresets; ++i)
	{
		Presets[i].LoadOrder = order;
	}
	for (unsigned int i = 0; i < Percussion.Size(); ++i)
	{
		Percussion[i].LoadOrder = order;
	}
}